

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-queue.h
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::ProducerConsumerQueue<unsigned_long>::pop(ProducerConsumerQueue<unsigned_long> *this)

{
  void *pvVar1;
  unsigned_long uVar2;
  long *in_RSI;
  unsigned_long local_20;
  
  if ((long *)*in_RSI == in_RSI) {
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::WaiterQueue<unsigned_long>::Node>,kj::_::PromiseDisposer,kj::List<kj::WaiterQueue<unsigned_long>::BaseNode,&kj::WaiterQueue<unsigned_long>::BaseNode::link>&>
              ((PromiseDisposer *)this,
               (List<kj::WaiterQueue<unsigned_long>::BaseNode,_&kj::WaiterQueue<unsigned_long>::BaseNode::link>
                *)(in_RSI + 3));
  }
  else {
    pvVar1 = (void *)in_RSI[1];
    uVar2 = *(unsigned_long *)((long)pvVar1 + 0x10);
    in_RSI[2] = in_RSI[2] + -1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pvVar1,0x18);
    local_20 = uVar2;
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
              ((PromiseDisposer *)this,&local_20);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> pop() {
    // Eventually pop a value from the queue.
    // Note that if your sinks lag your sources, the promise will always be ready.

    if (!values.empty()) {
      // We have at least one value, get the oldest.
      KJ_IASSERT(waiters.empty());

      auto value = kj::mv(values.back());
      values.pop_back();
      return kj::mv(value);
    } else {
      // We don't have any values, add ourselves to the waiting queue.
      return waiters.wait();
    }
  }